

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_arith_modw(DisasContext_conflict10 *ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2,
                      int sign)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 t3_1;
  TCGv_i32 t2_1;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  int sign_local;
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  ret_01 = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret_00,arg1);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret_01,arg2);
  if (sign == 0) {
    pTVar1 = tcg_const_i32_ppc64(tcg_ctx_00,1);
    pTVar2 = tcg_const_i32_ppc64(tcg_ctx_00,0);
    tcg_gen_movcond_i32_ppc64(tcg_ctx_00,TCG_COND_EQ,ret_01,ret_01,pTVar2,pTVar1,ret_01);
    tcg_gen_remu_i32_ppc64(tcg_ctx_00,pTVar2,ret_00,ret_01);
    tcg_gen_extu_i32_i64_ppc64(tcg_ctx_00,ret,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
  }
  else {
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_setcondi_i32_ppc64(tcg_ctx_00,TCG_COND_EQ,pTVar1,ret_00,-0x80000000);
    tcg_gen_setcondi_i32_ppc64(tcg_ctx_00,TCG_COND_EQ,pTVar2,ret_01,-1);
    tcg_gen_and_i32(tcg_ctx_00,pTVar1,pTVar1,pTVar2);
    tcg_gen_setcondi_i32_ppc64(tcg_ctx_00,TCG_COND_EQ,pTVar2,ret_01,0);
    tcg_gen_or_i32(tcg_ctx_00,pTVar1,pTVar1,pTVar2);
    tcg_gen_movi_i32(tcg_ctx_00,pTVar2,0);
    tcg_gen_movcond_i32_ppc64(tcg_ctx_00,TCG_COND_NE,ret_01,pTVar1,pTVar2,pTVar1,ret_01);
    tcg_gen_rem_i32_ppc64(tcg_ctx_00,pTVar2,ret_00,ret_01);
    tcg_gen_ext_i32_i64_ppc64(tcg_ctx_00,ret,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
  }
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret_01);
  return;
}

Assistant:

static inline void gen_op_arith_modw(DisasContext *ctx, TCGv ret, TCGv arg1,
                                     TCGv arg2, int sign)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, arg1);
    tcg_gen_trunc_tl_i32(tcg_ctx, t1, arg2);
    if (sign) {
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
        tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
        tcg_gen_and_i32(tcg_ctx, t2, t2, t3);
        tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
        tcg_gen_or_i32(tcg_ctx, t2, t2, t3);
        tcg_gen_movi_i32(tcg_ctx, t3, 0);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
        tcg_gen_rem_i32(tcg_ctx, t3, t0, t1);
        tcg_gen_ext_i32_tl(tcg_ctx, ret, t3);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    } else {
        TCGv_i32 t2 = tcg_const_i32(tcg_ctx, 1);
        TCGv_i32 t3 = tcg_const_i32(tcg_ctx, 0);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, t1, t1, t3, t2, t1);
        tcg_gen_remu_i32(tcg_ctx, t3, t0, t1);
        tcg_gen_extu_i32_tl(tcg_ctx, ret, t3);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
}